

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

size_t qHash(QMakeBaseKey *key)

{
  size_t seed;
  size_t sVar1;
  QString *in_RDI;
  size_t in_stack_fffffffffffffff0;
  
  seed = qHash(in_RDI,in_stack_fffffffffffffff0);
  sVar1 = qHash(in_RDI,seed);
  return seed ^ sVar1 ^ (ulong)(*(byte *)&in_RDI[2].d.d & 1);
}

Assistant:

size_t qHash(const QMakeBaseKey &key)
{
    return qHash(key.root) ^ qHash(key.stash) ^ (uint)key.hostBuild;
}